

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

size_t encode_varint64(uint64_t val,char *buf)

{
  bool bVar1;
  size_t sVar2;
  
  sVar2 = 0;
  do {
    buf[sVar2] = (0x7f < val) << 7 | (byte)val & 0x7f;
    sVar2 = sVar2 + 1;
    bVar1 = 0x7f < val;
    val = val >> 7;
  } while (bVar1);
  return sVar2;
}

Assistant:

UPB_NOINLINE
static size_t encode_varint64(uint64_t val, char* buf) {
  size_t i = 0;
  do {
    uint8_t byte = val & 0x7fU;
    val >>= 7;
    if (val) byte |= 0x80U;
    buf[i++] = byte;
  } while (val);
  return i;
}